

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::re2_internal::Parse<short>(char *str,size_t n,short *dest,int radix)

{
  bool bVar1;
  long local_38;
  long r;
  short *psStack_28;
  int radix_local;
  short *dest_local;
  size_t n_local;
  char *str_local;
  
  r._4_4_ = radix;
  psStack_28 = dest;
  dest_local = (short *)n;
  n_local = (size_t)str;
  bVar1 = Parse<long>(str,n,&local_38,radix);
  if (bVar1) {
    if ((short)local_38 == local_38) {
      if (psStack_28 == (short *)0x0) {
        str_local._7_1_ = true;
      }
      else {
        *psStack_28 = (short)local_38;
        str_local._7_1_ = true;
      }
    }
    else {
      str_local._7_1_ = false;
    }
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

bool Parse(const char* str, size_t n, short* dest, int radix) {
  long r;
  if (!Parse(str, n, &r, radix)) return false;  // Could not parse
  if ((short)r != r) return false;              // Out of range
  if (dest == NULL) return true;
  *dest = (short)r;
  return true;
}